

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianF
          (AttitudeQuaternionEKF *this,VectorDynSize *x,MatrixDynSize *F)

{
  long lVar1;
  double *pdVar2;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *this_00
  ;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *this_01
  ;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
  *this_02;
  long in_RDI;
  double dVar3;
  PointerType startRow;
  Matrix3x3 dfgyrobias_by_dgyrobias;
  Matrix3x3 dfangvel_by_dgyrobias;
  MatrixDynSize dfq_by_dangvel;
  Matrix4x4 dfq_by_dq;
  Vector3 gyro_bias;
  Vector3 ang_vel;
  UnitQuaternion q;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff8b8;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffff8c0;
  size_t in_stack_fffffffffffff8c8;
  MatrixFixSize<4U,_4U> *in_stack_fffffffffffff8d0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff8d8;
  Scalar *in_stack_fffffffffffff8e8;
  MatrixDynSize *mat;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff8f0;
  MatrixDynSize local_268 [56];
  double local_230;
  MatrixFixSize<4U,_4U> local_228 [3];
  VectorFixSize<3U> local_70;
  VectorFixSize<3U> local_58;
  VectorFixSize<4U> local_40;
  byte local_1;
  
  lVar1 = iDynTree::VectorDynSize::size();
  if (lVar1 == *(long *)(in_RDI + 0x3d8)) {
    lVar1 = iDynTree::MatrixDynSize::rows();
    if (lVar1 == *(long *)(in_RDI + 0x3d8)) {
      lVar1 = iDynTree::MatrixDynSize::cols();
      if (lVar1 == *(long *)(in_RDI + 0x3d8)) {
        iDynTree::MatrixDynSize::zero();
        VectorFixSize<4U>::VectorFixSize(&local_40);
        VectorFixSize<3U>::VectorFixSize(&local_58);
        VectorFixSize<3U>::VectorFixSize(&local_70);
        toEigen((VectorDynSize *)in_stack_fffffffffffff8d8);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
        block<4,1>(in_stack_fffffffffffff8d8,(Index)in_stack_fffffffffffff8d0,
                   in_stack_fffffffffffff8c8);
        toEigen<4U>((VectorFixSize<4U> *)in_stack_fffffffffffff8d8);
        Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_fffffffffffff8c0,
                   (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>_>
                    *)in_stack_fffffffffffff8b8);
        toEigen((VectorDynSize *)in_stack_fffffffffffff8d8);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
        block<3,1>(in_stack_fffffffffffff8d8,(Index)in_stack_fffffffffffff8d0,
                   in_stack_fffffffffffff8c8);
        toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff8d8);
        Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                  (in_stack_fffffffffffff8c0,
                   (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
                    *)in_stack_fffffffffffff8b8);
        toEigen((VectorDynSize *)in_stack_fffffffffffff8d8);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
        block<3,1>(in_stack_fffffffffffff8d8,(Index)in_stack_fffffffffffff8d0,
                   in_stack_fffffffffffff8c8);
        toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff8d8);
        Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                  (in_stack_fffffffffffff8c0,
                   (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
                    *)in_stack_fffffffffffff8b8);
        MatrixFixSize<4U,_4U>::MatrixFixSize(local_228);
        dVar3 = 2.0 / *(double *)(in_RDI + 0x290);
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = VectorFixSize<3U>::operator()(&local_58,0);
        dVar3 = *pdVar2;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = VectorFixSize<3U>::operator()(&local_58,1);
        dVar3 = *pdVar2;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = VectorFixSize<3U>::operator()(&local_58,2);
        dVar3 = *pdVar2;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = dVar3;
        pdVar2 = VectorFixSize<3U>::operator()(&local_58,0);
        dVar3 = *pdVar2;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = -dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = -dVar3;
        pdVar2 = VectorFixSize<3U>::operator()(&local_58,1);
        dVar3 = *pdVar2;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = -dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = -dVar3;
        pdVar2 = VectorFixSize<3U>::operator()(&local_58,2);
        dVar3 = *pdVar2;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = -dVar3;
        pdVar2 = MatrixFixSize<4U,_4U>::operator()
                           (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            (size_t)in_stack_fffffffffffff8c0);
        *pdVar2 = -dVar3;
        local_230 = *(double *)(in_RDI + 0x290) * 0.5;
        toEigen<4u,4u>((MatrixFixSize<4U,_4U> *)in_stack_fffffffffffff8d8);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>
        ::operator*=(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        iDynTree::MatrixDynSize::MatrixDynSize(local_268);
        iDynTree::MatrixDynSize::resize((ulong)local_268,4);
        pdVar2 = VectorFixSize<4U>::operator()(&local_40,1);
        dVar3 = *pdVar2;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,2);
        *pdVar2 = -dVar3;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,0);
        *pdVar2 = -dVar3;
        pdVar2 = VectorFixSize<4U>::operator()(&local_40,2);
        dVar3 = *pdVar2;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,3);
        *pdVar2 = -dVar3;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,0);
        *pdVar2 = -dVar3;
        pdVar2 = VectorFixSize<4U>::operator()(&local_40,3);
        dVar3 = *pdVar2;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,1);
        *pdVar2 = -dVar3;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,0);
        *pdVar2 = -dVar3;
        pdVar2 = VectorFixSize<4U>::operator()(&local_40,3);
        dVar3 = *pdVar2;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,2);
        *pdVar2 = dVar3;
        pdVar2 = VectorFixSize<4U>::operator()(&local_40,2);
        dVar3 = *pdVar2;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,1);
        *pdVar2 = dVar3;
        pdVar2 = VectorFixSize<4U>::operator()(&local_40,1);
        mat = (MatrixDynSize *)*pdVar2;
        this_00 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)iDynTree::MatrixDynSize::operator()((ulong)local_268,3);
        *(MatrixDynSize **)this_00 = mat;
        pdVar2 = VectorFixSize<4U>::operator()(&local_40,0);
        startRow = (PointerType)((ulong)*pdVar2 ^ 0x8000000000000000);
        this_01 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)iDynTree::MatrixDynSize::operator()((ulong)local_268,3);
        *(PointerType *)this_01 = startRow;
        pdVar2 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_268,2);
        *pdVar2 = (double)startRow;
        this_02 = (Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
                   *)iDynTree::MatrixDynSize::operator()((ulong)local_268,1);
        ((MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_4,_4,_false>,_0>
          *)&(this_02->
             super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>,_0>
        )->m_data = startRow;
        toEigen(mat);
        Eigen::
        DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        operator*=(this_00,(Scalar *)mat);
        toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
        ::operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                      *)this_00,(Scalar *)mat);
        toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
        ::operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                      *)this_00,(Scalar *)mat);
        toEigen<4u,4u>((MatrixFixSize<4U,_4U> *)this_01);
        toEigen(mat);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<4,4>(this_01,(Index)startRow,(Index)pdVar2);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,4,4,false>
        ::operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_4,_4,_false>
                     *)this_02,
                    (DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffff8b8);
        toEigen(mat);
        toEigen(mat);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<4,3>(this_01,(Index)startRow,(Index)pdVar2);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,4,3,false>
        ::operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_4,_3,_false>
                     *)this_02,
                    (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffff8b8);
        toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
        toEigen(mat);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<3,3>(this_01,(Index)startRow,(Index)pdVar2);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,3,3,false>
        ::operator=(this_02,in_stack_fffffffffffff8b8);
        toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_01);
        toEigen(mat);
        Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        block<3,3>(this_01,(Index)startRow,(Index)pdVar2);
        Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,3,3,false>
        ::operator=(this_02,in_stack_fffffffffffff8b8);
        local_1 = 1;
        iDynTree::MatrixDynSize::~MatrixDynSize(local_268);
        goto LAB_00622e44;
      }
    }
    iDynTree::reportError
              ("AttitudeQuaternionEKF","computejacobianF","jacobian matrix size mismatch");
    local_1 = 0;
  }
  else {
    iDynTree::reportError("AttitudeQuaternionEKF","computejacobianF","state size mismatch");
    local_1 = 0;
  }
LAB_00622e44:
  return (bool)(local_1 & 1);
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianF(iDynTree::VectorDynSize& x, iDynTree::MatrixDynSize& F)
{
    using iDynTree::toEigen;

    if (x.size() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianF", "state size mismatch");
        return false;
    }

    if (F.rows() != m_state_size || F.cols() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianF", "jacobian matrix size mismatch");
        return false;
    }

    F.zero();

    iDynTree::UnitQuaternion q;
    iDynTree::Vector3 ang_vel, gyro_bias;
    toEigen(q) = toEigen(x).block<4,1>(0, 0);
    toEigen(ang_vel) = toEigen(x).block<3,1>(4, 0);
    toEigen(gyro_bias) = toEigen(x).block<3,1>(7, 0);

    iDynTree::Matrix4x4 dfq_by_dq;
    dfq_by_dq(0,0) = dfq_by_dq(1, 1) = dfq_by_dq(2, 2) = dfq_by_dq(3, 3) = (2.0/m_params_qekf.time_step_in_seconds);
    dfq_by_dq(1, 0) = dfq_by_dq(2, 3) = ang_vel(0);
    dfq_by_dq(2, 0) = dfq_by_dq(3, 1) = ang_vel(1);
    dfq_by_dq(3, 0) = dfq_by_dq(1, 2) = ang_vel(2);
    dfq_by_dq(0, 1) = dfq_by_dq(3, 2) = -ang_vel(0);
    dfq_by_dq(0, 2) = dfq_by_dq(1, 3) = -ang_vel(1);
    dfq_by_dq(0, 3) = dfq_by_dq(2, 1) = -ang_vel(2);
    toEigen(dfq_by_dq) *= (m_params_qekf.time_step_in_seconds/2.0);

    iDynTree::MatrixDynSize dfq_by_dangvel;
    dfq_by_dangvel.resize(4, 3);
    dfq_by_dangvel(0, 0) = dfq_by_dangvel(2, 2) = -q(1);
    dfq_by_dangvel(0, 1) = dfq_by_dangvel(3, 0) = -q(2);
    dfq_by_dangvel(0, 2) = dfq_by_dangvel(1, 1) = -q(3);
    dfq_by_dangvel(2, 0) = q(3);
    dfq_by_dangvel(1, 2) = q(2);
    dfq_by_dangvel(3, 1) = q(1);
    dfq_by_dangvel(1, 0) = dfq_by_dangvel(2, 1) = dfq_by_dangvel(3, 2) = -q(0);
    toEigen(dfq_by_dangvel) *= (m_params_qekf.time_step_in_seconds/2.0);

    iDynTree::Matrix3x3 dfangvel_by_dgyrobias(m_Id3);
    toEigen(dfangvel_by_dgyrobias) *= -1;

    iDynTree::Matrix3x3 dfgyrobias_by_dgyrobias(m_Id3);
    toEigen(dfgyrobias_by_dgyrobias) *= (1 - (m_params_qekf.bias_correlation_time_factor*m_params_qekf.time_step_in_seconds));

    toEigen(F).block<4,4>(0,0) = toEigen(dfq_by_dq);
    toEigen(F).block<4,3>(0,4) = toEigen(dfq_by_dangvel);
    toEigen(F).block<3,3>(4,7) = toEigen(dfangvel_by_dgyrobias);
    toEigen(F).block<3,3>(7,7) = toEigen(dfgyrobias_by_dgyrobias);

    return true;
}